

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O1

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                    *this,TPZParFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                          *cp)

{
  TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::TPZFrontMatrix(&this->
                    super_TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                   ,&PTR_PTR_019b9a08,
                   &cp->
                    super_TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                  );
  (this->
  super_TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ).super_TPZAbstractFrontMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZParFrontMatrix_019b9780;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fStore =
       (TPZEqnArray<std::complex<float>_> **)0x0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fStore =
       (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.fExtAlloc;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNElements = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>.fNAlloc = 0;
  (this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>.
  super_TPZVec<TPZEqnArray<std::complex<float>_>_*>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019c9b10;
  this->fFinish = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->fwritelock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->fwritelock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->fwritecond);
  TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>::Resize
            (&(this->fEqnStack).super_TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>,0);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}